

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

int64_t try_restoration_unit
                  (RestSearchCtxt *rsc,RestorationTileLimits *limits,RestorationUnitInfo *rui)

{
  byte bVar1;
  int plane;
  AV1_COMMON *pAVar2;
  SequenceHeader *pSVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  uint ss_y;
  uint local_12b0;
  RestorationLineBuffers rlbs;
  
  pAVar2 = rsc->cm;
  plane = rsc->plane;
  lVar6 = (long)plane;
  pSVar3 = pAVar2->seq_params;
  bVar1 = pSVar3->use_highbitdepth;
  if (lVar6 < 1) {
    local_12b0 = 0;
    ss_y = 0;
  }
  else {
    local_12b0 = (uint)(pSVar3->subsampling_x != 0);
    ss_y = (uint)(pSVar3->subsampling_y != 0);
  }
  lVar5 = (ulong)(0 < plane) * 4;
  av1_loop_restoration_filter_unit
            (limits,rui,&pAVar2->rst_info[lVar6].boundaries,&rlbs,rsc->plane_w,rsc->plane_h,
             local_12b0,ss_y,(uint)bVar1,pSVar3->bit_depth,
             (pAVar2->cur_frame->buf).store_buf_adr[lVar6 + -4],
             *(int *)((long)(pAVar2->cur_frame->buf).store_buf_adr + lVar5 + -0x28),
             rsc->dst->store_buf_adr[lVar6 + -4],
             *(int *)((long)rsc->dst->store_buf_adr + lVar5 + -0x28),pAVar2->rst_tmpbuf,0,
             pAVar2->error);
  iVar4 = sse_restoration_unit(limits,rsc->src,rsc->dst,plane,(uint)bVar1);
  return iVar4;
}

Assistant:

static int64_t try_restoration_unit(const RestSearchCtxt *rsc,
                                    const RestorationTileLimits *limits,
                                    const RestorationUnitInfo *rui) {
  const AV1_COMMON *const cm = rsc->cm;
  const int plane = rsc->plane;
  const int is_uv = plane > 0;
  const RestorationInfo *rsi = &cm->rst_info[plane];
  RestorationLineBuffers rlbs;
  const int bit_depth = cm->seq_params->bit_depth;
  const int highbd = cm->seq_params->use_highbitdepth;

  const YV12_BUFFER_CONFIG *fts = &cm->cur_frame->buf;
  // TODO(yunqing): For now, only use optimized LR filter in decoder. Can be
  // also used in encoder.
  const int optimized_lr = 0;

  av1_loop_restoration_filter_unit(
      limits, rui, &rsi->boundaries, &rlbs, rsc->plane_w, rsc->plane_h,
      is_uv && cm->seq_params->subsampling_x,
      is_uv && cm->seq_params->subsampling_y, highbd, bit_depth,
      fts->buffers[plane], fts->strides[is_uv], rsc->dst->buffers[plane],
      rsc->dst->strides[is_uv], cm->rst_tmpbuf, optimized_lr, cm->error);

  return sse_restoration_unit(limits, rsc->src, rsc->dst, plane, highbd);
}